

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_ffql_df_mips64(CPUMIPSState_conflict5 *env,uint32_t df,uint32_t wd,uint32_t ws)

{
  float_status *pfVar1;
  fpr_t *pfVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  float32 fVar7;
  long lVar8;
  float64 fVar9;
  uint uVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  float64 *pfVar15;
  float_status *status;
  wr_t wx;
  float64 local_48;
  float64 fStack_40;
  fpr_t *local_38;
  
  if (df == 2) {
    pfVar1 = &(env->active_tc).msa_fp_status;
    lVar8 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar7 = int32_to_float32_mips64
                        ((int)*(short *)((long)(env->active_fpu).fpr +
                                        lVar8 * 2 + (ulong)ws * 0x10 + 8),pfVar1);
      fVar7 = float32_scalbn_mips64(fVar7,-0xf,pfVar1);
      *(float32 *)((long)&local_48 + lVar8 * 4) = fVar7;
      if ((fVar7 & 0x7fffffff) == 0) {
        uVar14 = (uint)(env->active_tc).msa_fp_status.float_exception_flags;
      }
      else {
        bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar14 = (uint)bVar3;
        if ((fVar7 & 0x7f800000) == 0) {
          uVar14 = bVar3 | 0x10;
        }
      }
      uVar5 = ieee_ex_to_mips_mips64(uVar14);
      uVar10 = (env->active_tc).msacsr;
      uVar13 = (uVar10 & 0x1000000) >> 0x18 & uVar14 >> 6;
      uVar12 = 3;
      if ((uVar10 & 0x1000000) == 0) {
        uVar12 = uVar13;
      }
      if (uVar14 < 0x80) {
        uVar12 = uVar13;
      }
      uVar12 = uVar12 | uVar5;
      uVar6 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
      uVar13 = uVar6 | uVar12;
      uVar14 = uVar5 & 0xfffffffc;
      if ((uVar6 != 0 || (uVar12 & 1) != 0) || (uVar10 & 0x100) != 0) {
        uVar14 = uVar13;
      }
      if ((uVar12 & 2) == 0) {
        uVar14 = uVar13;
      }
      if ((uVar14 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
        uVar12 = uVar14 << 0xc;
LAB_008c3a45:
        (env->active_tc).msacsr = uVar12 & 0x3f000 | uVar10;
        if (((uVar10 >> 7 & 0x1f | 0x20) & uVar14) != 0) goto LAB_008c3a60;
      }
      else {
        if ((uVar10 >> 0x12 & 1) == 0) {
          uVar12 = uVar14 << 0xc | uVar10;
          uVar10 = uVar10 & 0xfff80fff;
          goto LAB_008c3a45;
        }
LAB_008c3a60:
        fVar7 = float32_default_nan_mips64(pfVar1);
        *(float32 *)((long)&local_48 + lVar8 * 4) = fVar7 & 0xffffffc0 ^ 0x400000 | uVar14;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1c5f,
                    "void helper_msa_ffql_df_mips64(CPUMIPSState *, uint32_t, uint32_t, uint32_t)");
    }
    local_38 = (env->active_fpu).fpr + ws;
    pfVar1 = &(env->active_tc).msa_fp_status;
    lVar8 = 2;
    pfVar15 = &local_48;
    bVar4 = true;
    do {
      bVar11 = bVar4;
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      fVar9 = int32_to_float64_mips64(local_38->fs[lVar8],pfVar1);
      fVar9 = float64_scalbn_mips64(fVar9,-0x1f,pfVar1);
      *pfVar15 = fVar9;
      if ((fVar9 & 0x7fffffffffffffff) == 0) {
        uVar14 = (uint)(env->active_tc).msa_fp_status.float_exception_flags;
      }
      else {
        bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar14 = (uint)bVar3;
        if ((fVar9 & 0x7ff0000000000000) == 0) {
          uVar14 = bVar3 | 0x10;
        }
      }
      uVar5 = ieee_ex_to_mips_mips64(uVar14);
      uVar10 = (env->active_tc).msacsr;
      uVar13 = (uVar10 & 0x1000000) >> 0x18 & uVar14 >> 6;
      uVar12 = 3;
      if ((uVar10 & 0x1000000) == 0) {
        uVar12 = uVar13;
      }
      if (uVar14 < 0x80) {
        uVar12 = uVar13;
      }
      uVar12 = uVar12 | uVar5;
      uVar6 = (uint)((uVar10 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
      uVar13 = uVar6 | uVar12;
      uVar14 = uVar5 & 0xfffffffc;
      if ((uVar6 != 0 || (uVar12 & 1) != 0) || (uVar10 & 0x100) != 0) {
        uVar14 = uVar13;
      }
      if ((uVar12 & 2) == 0) {
        uVar14 = uVar13;
      }
      if ((uVar14 & (uVar10 >> 7 & 0x1f | 0x20)) == 0) {
        uVar12 = uVar14 << 0xc;
LAB_008c38ee:
        (env->active_tc).msacsr = uVar12 & 0x3f000 | uVar10;
        if (((uVar10 >> 7 & 0x1f | 0x20) & uVar14) != 0) goto LAB_008c3909;
      }
      else {
        if ((uVar10 >> 0x12 & 1) == 0) {
          uVar12 = uVar14 << 0xc | uVar10;
          uVar10 = uVar10 & 0xfff80fff;
          goto LAB_008c38ee;
        }
LAB_008c3909:
        fVar9 = float64_default_nan_mips64(pfVar1);
        *pfVar15 = (long)(int)uVar14 | fVar9 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
      lVar8 = 3;
      pfVar15 = &fStack_40;
      bVar4 = false;
    } while (bVar11);
  }
  pfVar2 = (env->active_fpu).fpr + wd;
  pfVar2->fd = local_48;
  (&pfVar2->fd)[1] = fStack_40;
  return;
}

Assistant:

void helper_msa_ffql_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
                        uint32_t ws)
{
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    uint32_t i;

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_UNOP(pwx->w[i], from_q16, Lh(pws, i), 32);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_UNOP(pwx->d[i], from_q32, Lw(pws, i), 64);
        }
        break;
    default:
        assert(0);
    }

    msa_move_v(pwd, pwx);
}